

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NwnStreams.h
# Opt level: O2

size_t __thiscall CNwnMemoryStream::Read(CNwnMemoryStream *this,void *pBuffer,size_t nCount)

{
  ulong __n;
  
  __n = (long)this->m_pauchEnd - (long)this->m_pauchPos;
  if (nCount <= __n) {
    __n = nCount;
  }
  memcpy(pBuffer,this->m_pauchPos,__n);
  this->m_pauchPos = this->m_pauchPos + __n;
  return __n;
}

Assistant:

virtual size_t Read (void *pBuffer, size_t nCount)
	{
		size_t nRemaining = m_pauchEnd - m_pauchPos;
		if (nRemaining < nCount)
			nCount = nRemaining;
		memcpy (pBuffer, m_pauchPos, nCount);
		m_pauchPos += nCount;
		return nCount;
    }